

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O1

int floatx80_eq_quiet_mips64(floatx80 a,floatx80 b,float_status *status)

{
  bool bVar1;
  uint64_t uVar2;
  ushort uVar3;
  
  uVar2 = a.low;
  uVar3 = a.high & 0x7fff;
  if ((long)uVar2 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)b.low < 0
       ) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
           uVar3 != 0x7fff) &&
         (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
          (b.high & 0x7fff) != 0x7fff)) {
        if (uVar2 != b.low) {
          return 0;
        }
        if (a.high == b.high) {
          return 1;
        }
        if (uVar2 != 0) {
          return 0;
        }
        return (int)(((b._8_4_ | a._8_4_) & 0x7fff) == 0);
      }
      if (status->snan_bit_is_one == '\0') {
        bVar1 = (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) ==
                 (undefined1  [16])0x0 && uVar3 == 0x7fff) &&
                ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) !=
                (undefined1  [16])0x0;
      }
      else {
        bVar1 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) !=
                (undefined1  [16])0x0 && uVar3 == 0x7fff;
      }
      if (!bVar1) {
        if (status->snan_bit_is_one == '\0') {
          bVar1 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) ==
                  (undefined1  [16])0x0 &&
                  ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                  (undefined1  [16])0x0;
        }
        else {
          bVar1 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) !=
                  (undefined1  [16])0x0;
        }
        if ((b._8_4_ & 0x7fff) != 0x7fff) {
          return 0;
        }
        if (!bVar1) {
          return 0;
        }
      }
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return 0;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}